

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_label_name_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::CheckLabelNameTest_reject_le_for_histogram_Test::TestBody
          (CheckLabelNameTest_reject_le_for_histogram_Test *this)

{
  ParamType *pPVar1;
  char *message;
  bool local_49;
  AssertHelper local_48;
  internal local_40 [8];
  undefined8 *local_38;
  string local_30;
  
  pPVar1 = testing::WithParamInterface<prometheus::MetricType>::GetParam();
  local_48.data_._0_1_ = *pPVar1 != Histogram;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"le","");
  pPVar1 = testing::WithParamInterface<prometheus::MetricType>::GetParam();
  local_49 = CheckLabelName(&local_30,*pPVar1);
  testing::internal::CmpHelperEQ<bool,bool>
            (local_40,"GetParam() != MetricType::Histogram","CheckLabelName(\"le\")",
             (bool *)&local_48,&local_49);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_38;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/check_label_name_test.cc"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_38 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_38 != local_38 + 2) {
      operator_delete((undefined8 *)*local_38);
    }
    operator_delete(local_38);
  }
  return;
}

Assistant:

TEST_P(CheckLabelNameTest, reject_le_for_histogram) {
  EXPECT_EQ(GetParam() != MetricType::Histogram, CheckLabelName("le"));
}